

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O2

PrimInfo *
embree::avx::createPrimRefArrayMBlur
          (PrimInfo *__return_storage_ptr__,Scene *scene,GTypeMask types,size_t numPrimRefs,
          mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor,size_t itime)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  task *ptVar5;
  runtime_error *prVar6;
  ulong uVar7;
  task_group_context *ptVar8;
  ulong uVar9;
  size_t i_2;
  ulong uVar10;
  size_t i_1;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  size_t N;
  ulong uVar14;
  size_t i;
  size_t sVar15;
  PrimInfoT<embree::BBox<embree::Vec3fa>_> *this;
  size_t *psVar16;
  unsigned_long end;
  PrimInfo *this_00;
  undefined1 local_2e3a [2];
  size_t taskCount;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2e30;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_2e28;
  PrimInfo *local_2e20;
  mvector<PrimRef> *local_2e18;
  Iterator2 *local_2e10;
  atomic<tbb::detail::r1::tbb_exception_ptr_*> local_2e08;
  void *local_2e00;
  intrusive_list_node local_2df8;
  intrusive_list_node local_2de8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2dd8;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_2dc8;
  context_list *pcStack_2dc0;
  intrusive_list_node *local_2db8;
  intrusive_list_node *piStack_2db0;
  __pointer_type local_2da8;
  void *pvStack_2da0;
  string_resource_index local_2d98;
  size_t sStack_2d90;
  task_group_context context;
  undefined1 local_2d08 [8];
  undefined8 uStack_2d00;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_2cf8;
  context_list *pcStack_2cf0;
  intrusive_list_node *local_2ce8;
  intrusive_list_node *piStack_2ce0;
  atomic<tbb::detail::r1::tbb_exception_ptr_*> local_2cd8;
  void *pvStack_2cd0;
  undefined1 local_2cc8 [16];
  Iterator2 iter;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_2c98;
  char acStack_2c90 [8];
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_2c88;
  context_list *pcStack_2c80;
  undefined4 local_2c78;
  undefined4 uStack_2c74;
  undefined4 uStack_2c70;
  undefined4 uStack_2c6c;
  undefined4 local_2c68;
  undefined4 uStack_2c64;
  undefined4 uStack_2c60;
  undefined4 uStack_2c5c;
  undefined1 local_2c58 [16];
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  pstate.super_ParallelForForState.taskCount = 0;
  iter.mblur = true;
  local_2e18 = prims;
  local_2e08._M_b._M_p = (__base_type)(__base_type)progressMonitor;
  local_2e00 = (void *)numPrimRefs;
  iter.scene = scene;
  iter.typemask = types;
  (**progressMonitor->_vptr_BuildProgressMonitor)(progressMonitor,0);
  sVar11 = (scene->geometries).size_active;
  uVar14 = 0;
  context.my_cpu_ctl_env = (uint64_t)&iter;
  for (sVar15 = 0; sVar11 != sVar15; sVar15 = sVar15 + 1) {
    sVar3 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::operator()
                      ((anon_class_8_1_4d25ca37 *)&context,sVar15);
    uVar14 = uVar14 + sVar3;
  }
  local_2e20 = __return_storage_ptr__;
  pstate.super_ParallelForForState.N = uVar14;
  iVar2 = tbb::detail::d1::max_concurrency();
  uVar7 = uVar14 + 0x3ff >> 10;
  if ((ulong)(long)iVar2 < uVar7) {
    uVar7 = (long)iVar2;
  }
  uVar4 = 0x40;
  if (uVar7 < 0x40) {
    uVar4 = uVar7;
  }
  sVar11 = 0;
  pstate.super_ParallelForForState.taskCount = uVar4 + (uVar4 == 0);
  pstate.super_ParallelForForState.i0[0] = 0;
  pstate.super_ParallelForForState.j0[0] = 0;
  uVar4 = uVar14 / pstate.super_ParallelForForState.taskCount;
  uVar7 = 1;
  uVar10 = 0;
  while (sVar15 = pstate.super_ParallelForForState.taskCount,
        uVar7 < pstate.super_ParallelForForState.taskCount) {
    sVar15 = ParallelForForState::init<embree::Scene::Iterator2>::anon_class_8_1_4d25ca37::
             operator()((anon_class_8_1_4d25ca37 *)&context,sVar11);
    uVar12 = (uVar7 + 1) * uVar14;
    uVar13 = 0;
    uVar9 = uVar10;
    for (; ((uVar10 = (uVar9 + sVar15) - uVar13, uVar13 < sVar15 && (uVar4 <= uVar10)) &&
           (uVar7 < pstate.super_ParallelForForState.taskCount)); uVar7 = uVar7 + 1) {
      pstate.super_ParallelForForState.i0[uVar7] = sVar11;
      uVar13 = uVar13 + (uVar4 - uVar9);
      pstate.super_ParallelForForState.j0[uVar7] = uVar13;
      uVar10 = uVar12 / pstate.super_ParallelForForState.taskCount;
      uVar12 = uVar12 + uVar14;
      uVar9 = uVar4;
      uVar4 = uVar10;
    }
    sVar11 = sVar11 + 1;
  }
  ptVar8 = (task_group_context *)local_2d08;
  local_2d08 = (undefined1  [8])0x7f8000007f800000;
  uStack_2d00._0_4_ = (__atomic_base<unsigned_int>)0x7f800000;
  uStack_2d00._4_1_ = gold_2021U1;
  uStack_2d00._5_1_ = (context_traits)0x0;
  uStack_2d00._6_1_ = (__atomic_base<unsigned_char>)0x80;
  uStack_2d00._7_1_ = 0x7f;
  local_2cf8.my_parent = (task_group_context *)0xff800000ff800000;
  pcStack_2cf0 = (context_list *)0xff800000ff800000;
  local_2ce8 = (intrusive_list_node *)0x7f8000007f800000;
  piStack_2ce0 = (intrusive_list_node *)0x7f8000007f800000;
  local_2cd8._M_b._M_p = (__base_type)(__pointer_type)0xff800000ff800000;
  pvStack_2cd0 = (void *)0xff800000ff800000;
  local_2cc8 = ZEXT816(0) << 0x20;
  local_2de8.my_prev_node = &local_2df8;
  local_2df8.my_prev_node = (intrusive_list_node *)local_2e18;
  local_2df8.my_next_node = (intrusive_list_node *)&itime;
  pcStack_2dc0 = (context_list *)&local_2e10;
  local_2e10 = &iter;
  piStack_2db0 = &local_2de8;
  local_2dd8._8_8_ = &taskCount;
  local_2dd8._0_8_ = &pstate;
  local_2db8 = (intrusive_list_node *)local_2e3a;
  taskCount = pstate.super_ParallelForForState.taskCount;
  local_2de8.my_next_node = (intrusive_list_node *)local_2e10;
  local_2dc8 = (anon_union_8_2_d71db6ad_for_task_group_context_11)ptVar8;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_2e30 = &local_2dd8;
  if (sVar15 != 0) {
    local_2e28.my_parent = (task_group_context *)0x0;
    ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2e28.my_parent,0xc0);
    ptVar5->m_reserved[2] = 0;
    ptVar5->m_reserved[3] = 0;
    ptVar5->m_reserved[4] = 0;
    ptVar5->m_reserved[5] = 0;
    (ptVar5->super_task_traits).m_version_and_traits = 0;
    ptVar5->m_reserved[0] = 0;
    ptVar5->m_reserved[1] = 0;
    ptVar5->m_reserved[2] = 0;
    ptVar5->_vptr_task = (_func_int **)&PTR__task_021ef1a0;
    ptVar5[1]._vptr_task = (_func_int **)sVar15;
    ptVar5[1].super_task_traits.m_version_and_traits = 0;
    ptVar5[1].m_reserved[0] = 1;
    ptVar5[1].m_reserved[1] = (uint64_t)&local_2e30;
    ptVar5[1].m_reserved[2] = 0;
    ptVar5[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar5[1].m_reserved + 5),
               (auto_partitioner *)(local_2e3a + 1));
    ptVar5[2].super_task_traits.m_version_and_traits = (uint64_t)local_2e28;
    local_2c98 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
                 0x0;
    acStack_2c90[0] = '\x01';
    acStack_2c90[1] = '\0';
    acStack_2c90[2] = '\0';
    acStack_2c90[3] = '\0';
    local_2c88 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x1;
    pcStack_2c80 = (context_list *)0x1;
    ptVar5[1].m_reserved[4] = (uint64_t)&local_2c98;
    ptVar8 = &context;
    tbb::detail::r1::execute_and_wait(ptVar5,ptVar8,(wait_context *)&local_2c88,ptVar8);
  }
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
  this_00 = local_2e20;
  if (cVar1 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    *(undefined1 (*) [8])
     &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = local_2d08
    ;
    *(undefined8 *)
     ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8)
         = uStack_2d00;
    *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
     &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = local_2cf8
    ;
    *(context_list **)
     ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8)
         = pcStack_2cf0;
    *(intrusive_list_node **)
     &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = local_2ce8
    ;
    *(intrusive_list_node **)
     ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8)
         = piStack_2ce0;
    *(__base_type *)
     &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
         local_2cd8._M_b._M_p;
    *(void **)((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
                      field_0 + 8) = pvStack_2cd0;
    this_00->begin = local_2cc8._0_8_;
    this_00->end = local_2cc8._8_8_;
    this = pstate.prefix_state.sums;
    for (uVar14 = 0; uVar14 < taskCount; uVar14 = uVar14 + 1) {
      context.my_cpu_ctl_env =
           *(uint64_t *)
            &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0;
      context._8_8_ =
           *(undefined8 *)
            ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                    field_0 + 8);
      context.field_6 =
           *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
            &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0;
      context.my_context_list =
           *(context_list **)
            ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                    field_0 + 8);
      context.my_node.my_prev_node =
           *(intrusive_list_node **)
            &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0;
      context.my_node.my_next_node =
           *(intrusive_list_node **)
            ((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.
                    field_0 + 8);
      context.my_exception._M_b._M_p =
           *(__base_type *)
            &this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0;
      context.my_itt_caller =
           *(void **)((long)&this[-0x40].super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.
                             upper.field_0 + 8);
      context.my_name = this[-0x40].begin;
      context.padding._0_8_ = this[-0x40].end;
      PrimInfoT<embree::BBox<embree::Vec3fa>_>::operator=(this,this_00);
      createPrimRefArrayMBlur::anon_class_1_0_00000001::operator()
                ((PrimInfo *)&local_2dd8.field_1,(anon_class_1_0_00000001 *)this_00,
                 (PrimInfo *)&context,(PrimInfo *)ptVar8);
      *(undefined8 *)
       &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
           local_2dd8._0_8_;
      *(undefined8 *)
       ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8
       ) = local_2dd8._8_8_;
      *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
       &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
           local_2dc8;
      *(context_list **)
       ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8
       ) = pcStack_2dc0;
      *(intrusive_list_node **)
       &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
           local_2db8;
      *(intrusive_list_node **)
       ((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8
       ) = piStack_2db0;
      *(__pointer_type *)
       &(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
           local_2da8;
      *(void **)((long)&(this_00->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
                        field_0 + 8) = pvStack_2da0;
      this_00->begin = local_2d98;
      this_00->end = sStack_2d90;
      this = this + 1;
    }
    if ((void *)(this_00->end - this_00->begin) != local_2e00) {
      (***(_func_int ***)local_2e08._M_b._M_p)(local_2e08._M_b._M_p,0);
      sVar11 = pstate.super_ParallelForForState.taskCount;
      local_2dc8.my_parent = (task_group_context *)&local_2c98;
      local_2c98 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_>
                    *)0x7f8000007f800000;
      acStack_2c90[0] = '\0';
      acStack_2c90[1] = '\0';
      acStack_2c90[2] = -0x80;
      acStack_2c90[3] = '\x7f';
      acStack_2c90[4] = '\0';
      acStack_2c90[5] = '\0';
      acStack_2c90[6] = -0x80;
      acStack_2c90[7] = '\x7f';
      local_2c88.my_parent = (task_group_context *)0xff800000ff800000;
      pcStack_2c80 = (context_list *)0xff800000ff800000;
      local_2c78 = 0x7f800000;
      uStack_2c74 = 0x7f800000;
      uStack_2c70 = 0x7f800000;
      uStack_2c6c = 0x7f800000;
      local_2c68 = 0xff800000;
      uStack_2c64 = 0xff800000;
      uStack_2c60 = 0xff800000;
      uStack_2c5c = 0xff800000;
      local_2c58 = ZEXT816(0) << 0x20;
      local_2df8.my_prev_node = (intrusive_list_node *)local_2e18;
      local_2df8.my_next_node = (intrusive_list_node *)&itime;
      local_2e10 = &iter;
      local_2de8.my_prev_node = &local_2df8;
      taskCount = pstate.super_ParallelForForState.taskCount;
      local_2dd8._0_8_ = &pstate;
      ptVar8 = (task_group_context *)&taskCount;
      pcStack_2dc0 = (context_list *)&local_2e10;
      local_2db8 = (intrusive_list_node *)local_2e3a;
      piStack_2db0 = &local_2de8;
      local_2de8.my_next_node = (intrusive_list_node *)local_2e10;
      local_2dd8._8_8_ = ptVar8;
      tbb::detail::d1::task_group_context::task_group_context
                (&context,(context_traits)0x4,CUSTOM_CTX);
      local_2e30 = &local_2dd8;
      if (sVar11 != 0) {
        local_2e28.my_parent = (task_group_context *)0x0;
        ptVar5 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2e28.my_parent,0xc0)
        ;
        ptVar5->m_reserved[2] = 0;
        ptVar5->m_reserved[3] = 0;
        ptVar5->m_reserved[4] = 0;
        ptVar5->m_reserved[5] = 0;
        (ptVar5->super_task_traits).m_version_and_traits = 0;
        ptVar5->m_reserved[0] = 0;
        ptVar5->m_reserved[1] = 0;
        ptVar5->m_reserved[2] = 0;
        ptVar5->_vptr_task = (_func_int **)&PTR__task_021ef1e8;
        ptVar5[1]._vptr_task = (_func_int **)sVar11;
        ptVar5[1].super_task_traits.m_version_and_traits = 0;
        ptVar5[1].m_reserved[0] = 1;
        ptVar5[1].m_reserved[1] = (uint64_t)&local_2e30;
        ptVar5[1].m_reserved[2] = 0;
        ptVar5[1].m_reserved[3] = 1;
        tbb::detail::d1::auto_partition_type::auto_partition_type
                  ((auto_partition_type *)(ptVar5[1].m_reserved + 5),
                   (auto_partitioner *)(local_2e3a + 1));
        ptVar5[2].super_task_traits.m_version_and_traits = (uint64_t)local_2e28;
        local_2d08 = (undefined1  [8])0x0;
        uStack_2d00._0_4_ = (__atomic_base<unsigned_int>)0x1;
        local_2cf8 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x1;
        pcStack_2cf0 = (context_list *)0x1;
        ptVar5[1].m_reserved[4] = (uint64_t)local_2d08;
        ptVar8 = &context;
        tbb::detail::r1::execute_and_wait(ptVar5,ptVar8,(wait_context *)&local_2cf8,ptVar8);
      }
      cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
      if (cVar1 != '\0') {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"task cancelled");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context);
      local_2cc8._0_8_ = local_2c58._0_8_;
      local_2cc8._8_8_ = local_2c58._8_8_;
      psVar16 = &pstate.prefix_state.sums[0].begin;
      local_2d08 = (undefined1  [8])local_2c98;
      uStack_2d00 = (task_group_context *)CONCAT44(acStack_2c90._4_4_,acStack_2c90._0_4_);
      local_2cf8 = local_2c88;
      pcStack_2cf0 = pcStack_2c80;
      local_2ce8 = (intrusive_list_node *)CONCAT44(uStack_2c74,local_2c78);
      piStack_2ce0 = (intrusive_list_node *)CONCAT44(uStack_2c6c,uStack_2c70);
      local_2cd8._M_b._M_p = (__base_type)(__pointer_type)CONCAT44(uStack_2c64,local_2c68);
      pvStack_2cd0 = (void *)CONCAT44(uStack_2c5c,uStack_2c60);
      for (uVar14 = 0; uVar14 < taskCount; uVar14 = uVar14 + 1) {
        context.my_cpu_ctl_env = psVar16[-0x288];
        context._8_8_ = psVar16[-0x287];
        context.field_6 = *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(psVar16 + -0x286);
        context.my_context_list = (context_list *)psVar16[-0x285];
        context.my_node.my_prev_node = (intrusive_list_node *)psVar16[-0x284];
        context.my_node.my_next_node = (intrusive_list_node *)psVar16[-0x283];
        context.my_exception._M_b._M_p = (__base_type)psVar16[-0x282];
        context.my_itt_caller = (void *)psVar16[-0x281];
        context.my_name = psVar16[-0x280];
        context.padding._0_8_ = psVar16[-0x27f];
        *(undefined1 (*) [8])
         &(((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar16 + -8))->
          super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = local_2d08;
        psVar16[-7] = uStack_2d00;
        *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(psVar16 + -6) = local_2cf8;
        psVar16[-5] = (size_t)pcStack_2cf0;
        *(intrusive_list_node **)&(((BBox3fa *)(psVar16 + -4))->lower).field_0 = local_2ce8;
        psVar16[-3] = (size_t)piStack_2ce0;
        *(__base_type *)&((Vec3fa *)(psVar16 + -2))->field_0 = local_2cd8._M_b._M_p;
        psVar16[-1] = (size_t)pvStack_2cd0;
        *psVar16 = local_2cc8._0_8_;
        psVar16[1] = local_2cc8._8_8_;
        createPrimRefArrayMBlur::anon_class_1_0_00000001::operator()
                  ((PrimInfo *)&local_2dd8.field_1,(anon_class_1_0_00000001 *)local_2d08,
                   (PrimInfo *)&context,(PrimInfo *)ptVar8);
        local_2cc8._0_8_ = local_2d98;
        local_2cc8._8_8_ = sStack_2d90;
        psVar16 = psVar16 + 10;
        local_2d08 = (undefined1  [8])local_2dd8._0_8_;
        uStack_2d00 = local_2dd8._8_8_;
        local_2cf8 = local_2dc8;
        pcStack_2cf0 = pcStack_2dc0;
        local_2ce8 = local_2db8;
        piStack_2ce0 = piStack_2db0;
        local_2cd8._M_b._M_p = (__base_type)(__base_type)local_2da8;
        pvStack_2cd0 = pvStack_2da0;
      }
      *(undefined1 (*) [8])
       &(local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
           local_2d08;
      *(undefined8 *)
       ((long)&(local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       + 8) = uStack_2d00;
      *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)
       &(local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
           local_2cf8;
      *(context_list **)
       ((long)&(local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       + 8) = pcStack_2cf0;
      *(intrusive_list_node **)
       &(local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
           local_2ce8;
      *(intrusive_list_node **)
       ((long)&(local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       + 8) = piStack_2ce0;
      *(__base_type *)
       &(local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
           local_2cd8._M_b._M_p;
      *(void **)((long)&(local_2e20->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper
                        .field_0 + 8) = pvStack_2cd0;
      this_00->begin = local_2cc8._0_8_;
      this_00->end = local_2cc8._8_8_;
      this_00 = local_2e20;
    }
    return this_00;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"task cancelled");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PrimInfo createPrimRefArrayMBlur(Scene* scene, Geometry::GTypeMask types, const size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor, size_t itime)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,true);
      
      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
          return mesh->createPrimRefArrayMB(prims,itime,r,k,(unsigned)geomID);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
      {
        progressMonitor(0);
        pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
            return mesh->createPrimRefArrayMB(prims,itime,r,base.size(),(unsigned)geomID);
          }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      }
      return pinfo;
    }